

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Const.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Const::ArchiveOUT(ChFunction_Const *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Const>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_28._value = &this->C;
  local_28._name = "C";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChFunction_Const::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Const>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(C);
}